

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O0

void __thiscall
mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::VisitUnsupported
          (BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *this,Expr e)

{
  undefined8 uVar1;
  char *s;
  CStringRef in_stack_00000008;
  Kind in_stack_ffffffffffffffe4;
  BasicCStringRef<char> local_18 [3];
  
  uVar1 = __cxa_allocate_exception(0x18);
  internal::ExprBase::kind((ExprBase *)0x1b0cc7);
  s = mp::expr::str(in_stack_ffffffffffffffe4);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_18,s);
  MakeUnsupportedError<>(in_stack_00000008);
  __cxa_throw(uVar1,&UnsupportedError::typeinfo,UnsupportedError::~UnsupportedError);
}

Assistant:

Result VisitUnsupported(Expr e) {
    throw MakeUnsupportedError(str(e.kind()));
  }